

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dlerror.c
# Opt level: O1

int run_test_dlerror(void)

{
  uv_loop_t *puVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *unaff_RBX;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 uStack_d8;
  long alStack_d0 [5];
  undefined1 auStack_a8 [120];
  char *pcStack_30;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  pcStack_30 = (char *)0x1852b1;
  pcVar3 = (char *)uv_dlerror();
  if (pcVar3 == (char *)0x0) {
    pcStack_30 = (char *)0x1853bc;
    run_test_dlerror_cold_9();
LAB_001853bc:
    pcStack_30 = (char *)0x1853c1;
    run_test_dlerror_cold_8();
LAB_001853c1:
    pcStack_30 = (char *)0x1853ce;
    run_test_dlerror_cold_1();
LAB_001853ce:
    pcStack_30 = (char *)0x1853d3;
    run_test_dlerror_cold_7();
LAB_001853d3:
    pcStack_30 = (char *)0x1853db;
    run_test_dlerror_cold_2();
LAB_001853db:
    pcVar3 = unaff_RBX;
    pcStack_30 = (char *)0x1853e0;
    run_test_dlerror_cold_5();
LAB_001853e0:
    pcStack_30 = (char *)0x1853e8;
    run_test_dlerror_cold_3();
LAB_001853e8:
    pcStack_30 = (char *)0x1853ed;
    run_test_dlerror_cold_6();
  }
  else {
    pcStack_30 = (char *)0x1852c9;
    pcVar3 = strstr(pcVar3,"no error");
    if (pcVar3 == (char *)0x0) goto LAB_001853bc;
    pcStack_30 = (char *)0x1852e3;
    iVar2 = uv_dlopen("test/fixtures/load_error.node",&local_18);
    local_20 = (long)iVar2;
    local_28 = 0xffffffffffffffff;
    if (local_20 != -1) goto LAB_001853c1;
    pcStack_30 = (char *)0x18530b;
    pcVar3 = (char *)uv_dlerror(&local_18);
    if (pcVar3 == (char *)0x0) goto LAB_001853ce;
    pcStack_30 = (char *)0x185326;
    pcVar4 = strstr(pcVar3,"Dynamic loading not supported");
    if (pcVar4 == (char *)0x0) {
      pcStack_30 = (char *)0x18533a;
      pcVar4 = strstr(pcVar3,"test/fixtures/load_error.node");
      if (pcVar4 != (char *)0x0) goto LAB_00185343;
      goto LAB_001853e8;
    }
LAB_00185343:
    pcStack_30 = (char *)0x185352;
    pcVar4 = strstr(pcVar3,"no error");
    unaff_RBX = pcVar3;
    if (pcVar4 != (char *)0x0) goto LAB_001853d3;
    pcStack_30 = (char *)0x185361;
    pcVar3 = (char *)uv_dlerror(&local_18);
    if (pcVar3 == (char *)0x0) goto LAB_001853db;
    pcStack_30 = (char *)0x185378;
    pcVar4 = strstr(pcVar3,"Dynamic loading not supported");
    if (pcVar4 != (char *)0x0) {
LAB_00185391:
      pcStack_30 = (char *)0x1853a0;
      pcVar4 = strstr(pcVar3,"no error");
      if (pcVar4 == (char *)0x0) {
        pcStack_30 = (char *)0x1853af;
        uv_dlclose(&local_18);
        return 0;
      }
      goto LAB_001853e0;
    }
    pcStack_30 = (char *)0x18538c;
    pcVar4 = strstr(pcVar3,"test/fixtures/load_error.node");
    if (pcVar4 != (char *)0x0) goto LAB_00185391;
  }
  pcStack_30 = (char *)0x1853f2;
  run_test_dlerror_cold_4();
  pcStack_30 = pcVar3;
  iov = (uv_buf_t)uv_buf_init(buf,0x20);
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_signal_init(loop,auStack_a8);
  alStack_d0[0] = (long)iVar2;
  uStack_d8 = 0;
  if (alStack_d0[0] == 0) {
    iVar2 = uv_signal_start(auStack_a8,sig_func,10);
    alStack_d0[0] = (long)iVar2;
    uStack_d8 = 0;
    if (alStack_d0[0] != 0) goto LAB_0018569b;
    iVar2 = pipe(pipe_fds);
    alStack_d0[0] = (long)iVar2;
    uStack_d8 = 0;
    if (alStack_d0[0] != 0) goto LAB_001856aa;
    iVar2 = uv_thread_create(&uStack_d8,thread_main,alStack_d0);
    if (iVar2 != 0) goto LAB_001856b9;
    iVar2 = uv_fs_read(loop,&read_req,pipe_fds[0],&iov,1,0xffffffffffffffff,0);
    if (iVar2 != 0xd) goto LAB_001856c8;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_001856d7;
    iVar2 = uv_run(loop,0);
    if (iVar2 != 0) goto LAB_001856e6;
    iVar2 = close(pipe_fds[0]);
    if (iVar2 != 0) goto LAB_001856f5;
    iVar2 = close(pipe_fds[1]);
    if (iVar2 != 0) goto LAB_00185704;
    uv_close(auStack_a8,0);
    iVar2 = uv_thread_join(&uStack_d8);
    puVar1 = loop;
    if (iVar2 == 0) {
      uv_walk(loop,close_walk_cb,0);
      uv_run(puVar1,0);
      iVar2 = uv_loop_close(loop);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto <EXTERNAL>_uv_signal_stop;
    }
  }
  else {
    run_test_eintr_handling_cold_1();
LAB_0018569b:
    run_test_eintr_handling_cold_2();
LAB_001856aa:
    run_test_eintr_handling_cold_3();
LAB_001856b9:
    run_test_eintr_handling_cold_4();
LAB_001856c8:
    run_test_eintr_handling_cold_5();
LAB_001856d7:
    run_test_eintr_handling_cold_6();
LAB_001856e6:
    run_test_eintr_handling_cold_7();
LAB_001856f5:
    run_test_eintr_handling_cold_8();
LAB_00185704:
    run_test_eintr_handling_cold_9();
  }
  run_test_eintr_handling_cold_10();
<EXTERNAL>_uv_signal_stop:
  run_test_eintr_handling_cold_11();
  iVar2 = uv_signal_stop();
  return iVar2;
}

Assistant:

TEST_IMPL(dlerror) {
  const char* path = "test/fixtures/load_error.node";
  const char* dlerror_no_error = "no error";
  const char* msg;
  uv_lib_t lib;
  int r;

  lib.errmsg = NULL;
  lib.handle = NULL;
  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
  ASSERT_NOT_NULL(strstr(msg, dlerror_no_error));

  r = uv_dlopen(path, &lib);
  ASSERT_EQ(r, -1);

  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
#if !defined(__OpenBSD__) && !defined(__QNX__)
  /* musl's libc.a does not support dlopen(), only libc.so does. */
  if (NULL == strstr(msg, "Dynamic loading not supported"))
    ASSERT_NOT_NULL(strstr(msg, path));
#endif
  ASSERT_NULL(strstr(msg, dlerror_no_error));

  /* Should return the same error twice in a row. */
  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
#if !defined(__OpenBSD__) && !defined(__QNX__)
  /* musl's libc.a does not support dlopen(), only libc.so does. */
  if (NULL == strstr(msg, "Dynamic loading not supported"))
    ASSERT_NOT_NULL(strstr(msg, path));
#endif
  ASSERT_NULL(strstr(msg, dlerror_no_error));

  uv_dlclose(&lib);

  return 0;
}